

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

void Eto63_2(Clifford *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vector<Blade,_std::allocator<Blade>_> local_240;
  vector<Blade,_std::allocator<Blade>_> local_228;
  Clifford local_210;
  vector<Blade,_std::allocator<Blade>_> local_1f8;
  Clifford local_1e0;
  vector<Blade,_std::allocator<Blade>_> local_1c8;
  Clifford local_1b0;
  Clifford local_198;
  Clifford local_180;
  Clifford local_168;
  vector<Blade,_std::allocator<Blade>_> local_150;
  Clifford local_138;
  vector<Blade,_std::allocator<Blade>_> local_120;
  vector<Blade,_std::allocator<Blade>_> local_108;
  Clifford local_f0;
  vector<Blade,_std::allocator<Blade>_> local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  Clifford local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  vector<Blade,_std::allocator<Blade>_> local_78;
  Clifford local_60;
  Clifford local_48;
  vector<Blade,_std::allocator<Blade>_> local_28;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_78,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_90,&e1);
  operator|(&local_60,&local_78,&local_90);
  if (local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar1 = 0.0;
  }
  else {
    fVar1 = (local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d8,&e2);
  operator|(&local_a8,&local_c0,&local_d8);
  if (local_a8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_a8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = (local_a8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_108,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_120,&e3);
  operator|(&local_f0,&local_108,&local_120);
  if (local_f0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_f0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = (local_f0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_120);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_150,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1c8,&ex);
  operator*(&local_1b0,fVar1 * fVar1,&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1f8,&ey);
  operator*(&local_1e0,fVar2 * fVar2,&local_1f8);
  operator+(&local_198,&local_1b0,&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_228,&ez);
  operator*(&local_210,fVar3 * fVar3,&local_228);
  operator+(&local_180,&local_198,&local_210);
  operator*(&local_168,0.5,&local_180);
  operator+(&local_138,&local_150,&local_168);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_240,&eo);
  operator+(&local_48,&local_138,&local_240);
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data
              ._M_finish;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_138);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_168);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_180);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_210);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_228);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_198);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1f8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_150);
  return;
}

Assistant:

void Eto63_2(Clifford &p)
{
   float x;x<=(p|e1);
   float y;y<=(p|e2);
   float z;z<=(p|e3);
   p=p+0.5*(x*x*ex+y*y*ey+z*z*ez)+eo;//+x*y*(ex+ey)+x*z*(ex+ez)+z*y*(ex+ez)+eo;
}